

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O0

int FmsIOAddTypedIntArray(FmsIOContext *ctx,char *path,FmsIntType type,void *values,FmsInt n)

{
  long in_RCX;
  uint in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  ulong in_R8;
  uint64_t *v_7;
  uint32_t *v_6;
  uint16_t *v_5;
  uint8_t *v_4;
  int64_t *v_3;
  int32_t *v_2;
  int16_t *v_1;
  int8_t *v;
  uint epl;
  int retval;
  size_t j;
  size_t i;
  ulong local_40;
  ulong local_38;
  
  fprintf((FILE *)*in_RDI,"%s/Size: %lu\n",in_RSI,in_R8);
  fprintf((FILE *)*in_RDI,"%s/Type: %s\n",in_RSI,FmsIntTypeNames[in_EDX]);
  switch(in_EDX) {
  case 0:
    fprintf((FILE *)*in_RDI,"%s/Values: [",in_RSI);
    local_38 = 0;
    while (local_38 < in_R8) {
      for (local_40 = 0; local_40 < 3 && local_38 < in_R8; local_40 = local_40 + 1) {
        fprintf((FILE *)*in_RDI,"%d",(ulong)(uint)(int)*(char *)(in_RCX + local_38));
        if (local_38 < in_R8 - 1) {
          fprintf((FILE *)*in_RDI,", ");
        }
        local_38 = local_38 + 1;
      }
      if (local_38 < in_R8 - 1) {
        fprintf((FILE *)*in_RDI,"\n");
      }
    }
    fprintf((FILE *)*in_RDI,"]\n");
    break;
  case 1:
    fprintf((FILE *)*in_RDI,"%s/Values: [",in_RSI);
    local_38 = 0;
    while (local_38 < in_R8) {
      for (local_40 = 0; local_40 < 3 && local_38 < in_R8; local_40 = local_40 + 1) {
        fprintf((FILE *)*in_RDI,"%d",(ulong)(uint)(int)*(short *)(in_RCX + local_38 * 2));
        if (local_38 < in_R8 - 1) {
          fprintf((FILE *)*in_RDI,", ");
        }
        local_38 = local_38 + 1;
      }
      if (local_38 < in_R8 - 1) {
        fprintf((FILE *)*in_RDI,"\n");
      }
    }
    fprintf((FILE *)*in_RDI,"]\n");
    break;
  case 2:
    fprintf((FILE *)*in_RDI,"%s/Values: [",in_RSI);
    local_38 = 0;
    while (local_38 < in_R8) {
      for (local_40 = 0; local_40 < 3 && local_38 < in_R8; local_40 = local_40 + 1) {
        fprintf((FILE *)*in_RDI,"%d",(ulong)*(uint *)(in_RCX + local_38 * 4));
        if (local_38 < in_R8 - 1) {
          fprintf((FILE *)*in_RDI,", ");
        }
        local_38 = local_38 + 1;
      }
      if (local_38 < in_R8 - 1) {
        fprintf((FILE *)*in_RDI,"\n");
      }
    }
    fprintf((FILE *)*in_RDI,"]\n");
    break;
  case 3:
    fprintf((FILE *)*in_RDI,"%s/Values: [",in_RSI);
    local_38 = 0;
    while (local_38 < in_R8) {
      for (local_40 = 0; local_40 < 3 && local_38 < in_R8; local_40 = local_40 + 1) {
        fprintf((FILE *)*in_RDI,"%ld",*(undefined8 *)(in_RCX + local_38 * 8));
        if (local_38 < in_R8 - 1) {
          fprintf((FILE *)*in_RDI,", ");
        }
        local_38 = local_38 + 1;
      }
      if (local_38 < in_R8 - 1) {
        fprintf((FILE *)*in_RDI,"\n");
      }
    }
    fprintf((FILE *)*in_RDI,"]\n");
    break;
  case 4:
    fprintf((FILE *)*in_RDI,"%s/Values: [",in_RSI);
    local_38 = 0;
    while (local_38 < in_R8) {
      for (local_40 = 0; local_40 < 3 && local_38 < in_R8; local_40 = local_40 + 1) {
        fprintf((FILE *)*in_RDI,"%u",(ulong)*(byte *)(in_RCX + local_38));
        if (local_38 < in_R8 - 1) {
          fprintf((FILE *)*in_RDI,", ");
        }
        local_38 = local_38 + 1;
      }
      if (local_38 < in_R8 - 1) {
        fprintf((FILE *)*in_RDI,"\n");
      }
    }
    fprintf((FILE *)*in_RDI,"]\n");
    break;
  case 5:
    fprintf((FILE *)*in_RDI,"%s/Values: [",in_RSI);
    local_38 = 0;
    while (local_38 < in_R8) {
      for (local_40 = 0; local_40 < 3 && local_38 < in_R8; local_40 = local_40 + 1) {
        fprintf((FILE *)*in_RDI,"%u",(ulong)*(ushort *)(in_RCX + local_38 * 2));
        if (local_38 < in_R8 - 1) {
          fprintf((FILE *)*in_RDI,", ");
        }
        local_38 = local_38 + 1;
      }
      if (local_38 < in_R8 - 1) {
        fprintf((FILE *)*in_RDI,"\n");
      }
    }
    fprintf((FILE *)*in_RDI,"]\n");
    break;
  case 6:
    fprintf((FILE *)*in_RDI,"%s/Values: [",in_RSI);
    local_38 = 0;
    while (local_38 < in_R8) {
      for (local_40 = 0; local_40 < 3 && local_38 < in_R8; local_40 = local_40 + 1) {
        fprintf((FILE *)*in_RDI,"%u",(ulong)*(uint *)(in_RCX + local_38 * 4));
        if (local_38 < in_R8 - 1) {
          fprintf((FILE *)*in_RDI,", ");
        }
        local_38 = local_38 + 1;
      }
      if (local_38 < in_R8 - 1) {
        fprintf((FILE *)*in_RDI,"\n");
      }
    }
    fprintf((FILE *)*in_RDI,"]\n");
    break;
  case 7:
    fprintf((FILE *)*in_RDI,"%s/Values: [",in_RSI);
    local_38 = 0;
    while (local_38 < in_R8) {
      for (local_40 = 0; local_40 < 3 && local_38 < in_R8; local_40 = local_40 + 1) {
        fprintf((FILE *)*in_RDI,"%lu",*(undefined8 *)(in_RCX + local_38 * 8));
        if (local_38 < in_R8 - 1) {
          fprintf((FILE *)*in_RDI,", ");
        }
        local_38 = local_38 + 1;
      }
      if (local_38 < in_R8 - 1) {
        fprintf((FILE *)*in_RDI,"\n");
      }
    }
    fprintf((FILE *)*in_RDI,"]\n");
    break;
  default:
    return 1;
  }
  return 0;
}

Assistant:

static int
FmsIOAddTypedIntArray(FmsIOContext *ctx, const char *path, FmsIntType type,
                      const void *values, FmsInt n) {
  /* Shall we stick some type information into the ASCII to preserve the intended IntType? */
  size_t i, j;
  int retval = 0;
  const unsigned int epl = FMS_ELE_PER_LINE;

  fprintf(ctx->fp, "%s/Size: " FMS_LU "\n", path, n);
  fprintf(ctx->fp, "%s/Type: %s\n", path, FmsIntTypeNames[type]);

#define PRINT_MACRO(typename, T, format)    \
    do {                                    \
    const T *v = (const T *)(values);       \
    fprintf(ctx->fp, "%s/Values: [", path); \
    for(i = 0; i < n;) {                    \
        for(j = 0; j < epl && i < n; j++, i++) { \
            fprintf(ctx->fp, format, v[i]); \
            if(i < n-1)                     \
                fprintf(ctx->fp, ", ");     \
        }                                   \
        if(i < n-1)                         \
            fprintf(ctx->fp, "\n");         \
    }                                       \
    fprintf(ctx->fp, "]\n");                \
    } while(0)

  switch(type) {
#define CASES(typename, T, format)          \
        case typename:                          \
            PRINT_MACRO(typename, T, format);   \
            break;
    FOR_EACH_INT_TYPE(CASES)
#undef CASES
  default:
    E_RETURN(1);
    break;
  }
#undef PRINT_MACRO
  return retval;
}